

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int sasl_init_get_mechanism(SASL_INIT_HANDLE sasl_init,char **mechanism_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  SASL_INIT_INSTANCE *sasl_init_instance;
  uint32_t item_count;
  int result;
  char **mechanism_value_local;
  SASL_INIT_HANDLE sasl_init_local;
  
  if (sasl_init == (SASL_INIT_HANDLE)0x0) {
    sasl_init_instance._4_4_ = 0x29e0;
  }
  else {
    _item_count = mechanism_value;
    mechanism_value_local = (char **)sasl_init;
    iVar1 = amqpvalue_get_composite_item_count
                      (sasl_init->composite_value,(uint32_t *)&sasl_init_instance);
    if (iVar1 == 0) {
      if ((int)sasl_init_instance == 0) {
        sasl_init_instance._4_4_ = 0x29ee;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(sasl_init->composite_value,0);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          sasl_init_instance._4_4_ = 0x29f6;
        }
        else {
          iVar1 = amqpvalue_get_symbol(value,_item_count);
          if (iVar1 == 0) {
            sasl_init_instance._4_4_ = 0;
          }
          else {
            sasl_init_instance._4_4_ = 0x29fd;
          }
        }
      }
    }
    else {
      sasl_init_instance._4_4_ = 0x29e8;
    }
  }
  return sasl_init_instance._4_4_;
}

Assistant:

int sasl_init_get_mechanism(SASL_INIT_HANDLE sasl_init, const char** mechanism_value)
{
    int result;

    if (sasl_init == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        SASL_INIT_INSTANCE* sasl_init_instance = (SASL_INIT_INSTANCE*)sasl_init;
        if (amqpvalue_get_composite_item_count(sasl_init_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(sasl_init_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_symbol(item_value, mechanism_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}